

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_index.h
# Opt level: O2

Label __thiscall S2CellIndex::ContentsIterator::label(ContentsIterator *this)

{
  int iVar1;
  S2LogMessage SStack_18;
  
  iVar1 = (this->node_).label;
  if (iVar1 != -1) {
    return iVar1;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_index.h"
             ,0x248,kFatal,(ostream *)&std::cerr);
  std::operator<<(SStack_18.stream_,"Check failed: !done() ");
  abort();
}

Assistant:

inline bool S2CellIndex::ContentsIterator::done() const {
  return node_.label == kDoneContents;
}